

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  void *pvVar1;
  uint uVar2;
  char *pcVar3;
  void **ppvVar4;
  
  if (loop == (uv_loop_t *)0x0) {
    loop = uv_default_loop();
  }
  ppvVar4 = loop->handle_queue;
  while (ppvVar4 = (void **)*ppvVar4, ppvVar4 != loop->handle_queue) {
    if ((only_active == 0) || (((ulong)ppvVar4[7] & 4) != 0)) {
      uVar2 = *(int *)&((uv_loop_t *)(ppvVar4 + -2))->data - 1;
      pcVar3 = "<unknown>";
      if (uVar2 < 0x10) {
        pcVar3 = &DAT_006127e0 + *(int *)(&DAT_006127e0 + (ulong)uVar2 * 4);
      }
      pvVar1 = ppvVar4[7];
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",(ulong)(uint)(int)"R-"[((ulong)pvVar1 & 8) == 0],
              (ulong)(uint)(int)"A-"[((ulong)pvVar1 & 4) == 0],
              (ulong)(uint)(int)"I-"[((ulong)pvVar1 & 0x10) == 0],pcVar3,ppvVar4 + -4);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}